

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

enable_if_t<IteratorRange<const_double_(*)[3],_double[3]>::is_container>
gnuplotio::
deref_and_print<gnuplotio::IteratorRange<double_const(*)[3],double[3]>,gnuplotio::ModeBinfmt>
          (gnuplotio *stream,IteratorRange<const_double_(*)[3],_double[3]> *arg)

{
  plotting_empty_container *this;
  subiter_type subrange;
  
  if (arg->it == arg->end) {
    this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
    plotting_empty_container::plotting_empty_container(this);
  }
  else {
    subrange = IteratorRange<const_double_(*)[3],_double[3]>::deref_subiter(arg);
    if (subrange.it != subrange.end) {
      while (subrange.it != subrange.end) {
        deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeBinfmt>
                  (stream,&subrange);
        subrange.it = subrange.it + 1;
      }
      return;
    }
    this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
    plotting_empty_container::plotting_empty_container(this);
  }
  __cxa_throw(this,&plotting_empty_container::typeinfo,std::length_error::~length_error);
}

Assistant:

bool is_end() const { return it == end; }